

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProvider.cpp
# Opt level: O0

void __thiscall
ImageProvider::prepareGraphicBoard(ImageProvider *this,QImage *image,size_t tileSize)

{
  bool bVar1;
  type *ptVar2;
  mapped_type *pmVar3;
  pointer this_00;
  unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_> local_58;
  BoardSize local_4c;
  _Iterator<true> _Stack_48;
  BoardSize boardSize;
  _Iterator<true> __end1;
  _Iterator<true> __begin1;
  elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
  *__range1;
  size_t tileSize_local;
  QImage *image_local;
  ImageProvider *this_local;
  
  std::ranges::views::__adaptor::
  operator|<const_std::ranges::views::_Elements<0UL>_&,_std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_&>
            ((elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
              *)this,(map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>
                      *)&std::ranges::views::keys,(_Elements<0UL> *)tileSize);
  __end1 = std::ranges::
           elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
           ::begin((elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
                    *)&__begin1);
  _Stack_48 = std::ranges::
              elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
              ::end((elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
                     *)&__begin1);
  while (bVar1 = std::ranges::operator==(&__end1,&stack0xffffffffffffffb8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ptVar2 = std::ranges::
             elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
             ::_Iterator<true>::operator*(&__end1);
    local_4c = *ptVar2;
    bVar1 = Options::isImageToBeLoaded(local_4c);
    if ((bVar1) && (bVar1 = checkImageSize(this,image,local_4c,tileSize), bVar1)) {
      std::make_unique<GraphicBoard>();
      pmVar3 = std::
               map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>
               ::at(&this->images,&local_4c);
      std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>::operator=(pmVar3,&local_58)
      ;
      std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>::~unique_ptr(&local_58);
      pmVar3 = std::
               map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>
               ::at(&this->images,&local_4c);
      this_00 = std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>::operator->
                          (pmVar3);
      GraphicBoard::createTilesFromImage(this_00,image,local_4c,tileSize,Options::graphicMode);
    }
    std::ranges::
    elements_view<std::ranges::ref_view<std::map<BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>_>_>,_0UL>
    ::_Iterator<true>::operator++(&__end1);
  }
  return;
}

Assistant:

void ImageProvider::prepareGraphicBoard( QImage& image, size_t tileSize )
{
    for ( const auto boardSize : images | std::views::keys )
    {
        if (( Options::isImageToBeLoaded( boardSize )) && ( checkImageSize( image, boardSize, tileSize )))
        {
            images.at( boardSize ) = std::make_unique<GraphicBoard>();
            images.at( boardSize )->createTilesFromImage( image, boardSize, tileSize, Options::graphicMode );
        }
    }
}